

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_exponent<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
          (int exp,back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> it)

{
  type tVar1;
  uint value;
  char32_t local_2c;
  
  if (exp + 9999U < 19999) {
    if (exp < 0) {
      local_2c = L'-';
      buffer<char32_t>::push_back(it.container,&local_2c);
      exp = -exp;
    }
    else {
      local_2c = L'+';
      buffer<char32_t>::push_back(it.container,&local_2c);
    }
    value = exp;
    if (99 < (uint)exp) {
      value = (exp & 0xffffU) % 100;
      tVar1 = to_unsigned<int>((exp & 0xffffU) / 100);
      if (999 < (uint)exp) {
        local_2c = (char32_t)
                   "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(ulong)tVar1 * 2];
        buffer<char32_t>::push_back(it.container,&local_2c);
      }
      local_2c = (char32_t)
                 "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                 [(ulong)tVar1 * 2 + 1];
      buffer<char32_t>::push_back(it.container,&local_2c);
    }
    tVar1 = to_unsigned<int>(value);
    local_2c = (char32_t)
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               [(ulong)tVar1 * 2];
    buffer<char32_t>::push_back(it.container,&local_2c);
    local_2c = (char32_t)
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               [(ulong)tVar1 * 2 + 1];
    buffer<char32_t>::push_back(it.container,&local_2c);
    return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)it.container;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x508,"exponent out of range");
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}